

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O2

void __thiscall asl::Date::Date(Date *this,String *str,String *fmt)

{
  char cVar1;
  int month;
  int s_00;
  int day;
  int h;
  int m;
  anon_union_16_2_78e7fdac_for_String_2 *paVar2;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  int local_4c;
  char *s;
  
  if (fmt->_size == 0) {
    paVar2 = &fmt->field_2;
  }
  else {
    paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)(fmt->field_2)._str;
  }
  if (str->_size == 0) {
    paVar3 = &str->field_2;
  }
  else {
    paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(str->field_2)._str;
  }
  local_4c = 0;
  month = 0;
  day = 0;
  h = 0;
  m = 0;
  s_00 = 0;
  while( true ) {
    do {
      s = paVar3->_space;
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)((long)paVar2 + 1);
      cVar1 = paVar2->_space[0];
      paVar2 = paVar3;
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(s + 1);
    } while (cVar1 == '?');
    if (cVar1 == '\0') break;
    if (cVar1 == 'D') {
      day = parseSkipNumber(&s);
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)s;
    }
    else if (cVar1 == 'M') {
      month = parseSkipNumber(&s);
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)s;
    }
    else if (cVar1 == 's') {
      s_00 = parseSkipNumber(&s);
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)s;
    }
    else if (cVar1 == 'h') {
      h = parseSkipNumber(&s);
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)s;
    }
    else if (cVar1 == 'm') {
      m = parseSkipNumber(&s);
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)s;
    }
    else if (cVar1 == 'Y') {
      local_4c = parseSkipNumber(&s);
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)s;
    }
    else if (*s != cVar1) {
      this->_t = 0.0;
      return;
    }
  }
  construct(this,LOCAL,local_4c,month,day,h,m,s_00);
  return;
}

Assistant:

Date::Date(const String& str, const String& fmt)
{
	const char* f = fmt;
	const char* s = str;
	int         year = 0, month = 0, day = 0, hour = 0, minute = 0, second = 0;

	while (char c = *f++)
	{
		switch (c)
		{
		case 'Y':
			year = parseSkipNumber(s);
			break;
		case 'D':
			day = parseSkipNumber(s);
			break;
		case 'M':
			month = parseSkipNumber(s);
			break;
		case 'h':
			hour = parseSkipNumber(s);
			break;
		case 'm':
			minute = parseSkipNumber(s);
			break;
		case 's':
			second = parseSkipNumber(s);
			break;
		default:
			if (c != '?' && *s != c)
			{
				_t = 0;
				return;
			}
			s++;
		}
	}
	construct(LOCAL, year, month, day, hour, minute, second);
}